

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O0

int __thiscall TokenPipeEnd::TokenWrite(TokenPipeEnd *this,uint8_t token)

{
  ssize_t sVar1;
  int *piVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  ssize_t result;
  int local_10;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar1 = ::write(*in_RDI,&local_9,1);
    if (-1 < sVar1) {
      if (sVar1 == 0) {
        local_10 = -2;
      }
      else {
        local_10 = 0;
      }
      goto LAB_01b064a3;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_10 = -1;
LAB_01b064a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

int TokenPipeEnd::TokenWrite(uint8_t token)
{
    while (true) {
        ssize_t result = write(m_fd, &token, 1);
        if (result < 0) {
            // Failure. It's possible that the write was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return 0;
        }
    }
}